

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O1

int MMDB_read_node(MMDB_s *mmdb,uint32_t node_number,MMDB_search_node_s *node)

{
  ushort uVar1;
  uint uVar2;
  uint32_t uVar3;
  uint8_t *puVar4;
  ulong uVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  code *pcVar10;
  byte bVar11;
  byte bVar12;
  ulong uVar13;
  long lVar14;
  code *pcVar15;
  
  uVar1 = mmdb->full_record_byte_size;
  if (uVar1 == 8) {
    lVar14 = 4;
    pcVar10 = get_uint32;
  }
  else {
    if (uVar1 == 7) {
      lVar14 = 3;
      pcVar15 = get_right_28_bit_record;
      pcVar10 = get_left_28_bit_record;
      bVar6 = false;
      goto LAB_00103b30;
    }
    if (uVar1 != 6) {
      pcVar10 = (code *)0x0;
      bVar6 = true;
      pcVar15 = (code *)0x0;
      lVar14 = 0;
      goto LAB_00103b30;
    }
    lVar14 = 3;
    pcVar10 = get_uint24;
  }
  bVar6 = false;
  pcVar15 = pcVar10;
LAB_00103b30:
  iVar8 = 6;
  if ((!bVar6) && (iVar8 = 10, node_number <= (mmdb->metadata).node_count)) {
    puVar4 = mmdb->file_content;
    uVar7 = (*pcVar10)(puVar4 + uVar1 * node_number);
    node->left_record = (ulong)uVar7;
    uVar7 = (*pcVar15)(puVar4 + uVar1 * node_number + lVar14);
    uVar9 = (ulong)uVar7;
    node->right_record = uVar9;
    uVar5 = node->left_record;
    bVar11 = 3;
    bVar12 = 3;
    if (uVar5 != 0) {
      uVar13 = (ulong)(mmdb->metadata).node_count;
      if (uVar5 < uVar13) {
        bVar12 = 0;
      }
      else {
        bVar12 = 1;
        if (uVar5 != uVar13) {
          bVar12 = uVar5 - uVar13 < (ulong)mmdb->data_section_size ^ 3;
        }
      }
    }
    node->left_record_type = bVar12;
    if (uVar9 != 0) {
      uVar2 = (mmdb->metadata).node_count;
      if (uVar7 < uVar2) {
        bVar11 = 0;
      }
      else {
        bVar11 = 1;
        if (uVar2 != uVar7) {
          bVar11 = uVar9 - uVar2 < (ulong)mmdb->data_section_size ^ 3;
        }
      }
    }
    node->right_record_type = bVar11;
    uVar3 = (mmdb->metadata).node_count;
    (node->left_record_entry).mmdb = mmdb;
    (node->left_record_entry).offset = ((int)uVar5 - uVar3) - 0x10;
    uVar3 = (mmdb->metadata).node_count;
    (node->right_record_entry).mmdb = mmdb;
    (node->right_record_entry).offset = (uVar7 - uVar3) - 0x10;
    iVar8 = 0;
  }
  return iVar8;
}

Assistant:

int MMDB_read_node(const MMDB_s *const mmdb,
                   uint32_t node_number,
                   MMDB_search_node_s *const node) {
    record_info_s record_info = record_info_for_database(mmdb);
    if (record_info.right_record_offset == 0) {
        return MMDB_UNKNOWN_DATABASE_FORMAT_ERROR;
    }

    if (node_number > mmdb->metadata.node_count) {
        return MMDB_INVALID_NODE_NUMBER_ERROR;
    }

    const uint8_t *search_tree = mmdb->file_content;
    const uint8_t *record_pointer =
        &search_tree[node_number * record_info.record_length];
    node->left_record = record_info.left_record_getter(record_pointer);
    record_pointer += record_info.right_record_offset;
    node->right_record = record_info.right_record_getter(record_pointer);

    node->left_record_type = record_type(mmdb, node->left_record);
    node->right_record_type = record_type(mmdb, node->right_record);

    // Note that offset will be invalid if the record type is not
    // MMDB_RECORD_TYPE_DATA, but that's ok. Any use of the record entry
    // for other data types is a programming error.
    node->left_record_entry = (struct MMDB_entry_s){
        .mmdb = mmdb,
        .offset = data_section_offset_for_record(mmdb, node->left_record),
    };
    node->right_record_entry = (struct MMDB_entry_s){
        .mmdb = mmdb,
        .offset = data_section_offset_for_record(mmdb, node->right_record),
    };

    return MMDB_SUCCESS;
}